

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O2

void * __thiscall
anon_unknown.dwarf_5fce8::CtorEvalExternalInterface::getMemory
          (CtorEvalExternalInterface *this,Address address,Name memoryName,size_t size)

{
  iterator iVar1;
  pointer pcVar2;
  string *this_00;
  ulong __new_size;
  undefined1 local_60 [8];
  Name memoryName_local;
  allocator<char> local_29;
  
  memoryName_local.super_IString.str._M_len = memoryName.super_IString.str._M_str;
  local_60 = memoryName.super_IString.str._M_len;
  iVar1 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->memories)._M_h,(key_type *)local_60);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    __assert_fail("it != memories.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                  ,0x1d3,
                  "void *(anonymous namespace)::CtorEvalExternalInterface::getMemory(Address, Name, size_t)"
                 );
  }
  __new_size = size + address.addr;
  pcVar2 = *(pointer *)
            ((long)iVar1.
                   super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
                   ._M_cur + 0x18);
  if ((ulong)(*(long *)((long)iVar1.
                              super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
                              ._M_cur + 0x20) - (long)pcVar2) < __new_size) {
    if (this->MaximumMemory < __new_size) {
      this_00 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&memoryName_local.super_IString.str._M_str,
                 "excessively high memory address accessed",&local_29);
      std::__cxx11::string::string(this_00,(string *)&memoryName_local.super_IString.str._M_str);
      __cxa_throw(this_00,&(anonymous_namespace)::FailToEvalException::typeinfo,
                  FailToEvalException::~FailToEvalException);
    }
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
                      ._M_cur + 0x18),__new_size);
    pcVar2 = (((vector<char,_std::allocator<char>_> *)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_true>
                     ._M_cur + 0x18))->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  return pcVar2 + address.addr;
}

Assistant:

void* getMemory(Address address, Name memoryName, size_t size) {
    auto it = memories.find(memoryName);
    assert(it != memories.end());
    auto& memory = it->second;
    // resize the memory buffer as needed.
    auto max = address + size;
    if (max > memory.size()) {
      if (max > MaximumMemory) {
        throw FailToEvalException("excessively high memory address accessed");
      }
      memory.resize(max);
    }
    return &memory[address];
  }